

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_APIGetNextLogMessage(hrgls_API api,hrgls_Message *message)

{
  bool bVar1;
  size_type sVar2;
  reference this;
  hrgls_Message MessageToCopy;
  undefined1 local_40 [8];
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> ret;
  hrgls_Status s;
  hrgls_Message *message_local;
  hrgls_API api_local;
  
  ret.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  if (api == (hrgls_API)0x0) {
    return 0x3ee;
  }
  if (message == (hrgls_Message *)0x0) {
    return 0x3e9;
  }
  hrgls::API::GetPendingLogMessages
            ((vector<hrgls::Message,_std::allocator<hrgls::Message>_> *)local_40,api->api,1);
  sVar2 = std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::size
                    ((vector<hrgls::Message,_std::allocator<hrgls::Message>_> *)local_40);
  if (sVar2 != 0) {
    this = std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::front
                     ((vector<hrgls::Message,_std::allocator<hrgls::Message>_> *)local_40);
    MessageToCopy = hrgls::Message::RawMessage(this);
    ret.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = hrgls_MessageCopy(message,MessageToCopy);
    if (ret.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      bVar1 = true;
      api_local._4_4_ =
           ret.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      goto LAB_00108ed6;
    }
  }
  bVar1 = false;
LAB_00108ed6:
  std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::~vector
            ((vector<hrgls::Message,_std::allocator<hrgls::Message>_> *)local_40);
  if (!bVar1) {
    api_local._4_4_ = hrgls::API::GetStatus(api->api);
  }
  return api_local._4_4_;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_APIGetNextLogMessage(hrgls_API api, hrgls_Message *message)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!api) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!message) {
      return hrgls_STATUS_BAD_PARAMETER;
    }

    // Get at most a single message.
    try {
      ::std::vector<::hrgls::Message> ret = api->api->GetPendingLogMessages(1);
      if (ret.size() > 0) {
        // Copy the first (only) message into the pointed-to return location.
        if (hrgls_STATUS_OKAY != (s = hrgls_MessageCopy(message, ret.front().RawMessage()))) {
          return s;
        }
      }
    } catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }

    return api->api->GetStatus();
  }